

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O2

MemoryAccountantAllocationNode * __thiscall
MemoryAccountant::findNodeOfSize(MemoryAccountant *this,size_t size)

{
  MemoryAccountantAllocationNode *pMVar1;
  MemoryAccountantAllocationNode *pMVar2;
  
  if (this->useCacheSizes_ == false) {
    while( true ) {
      pMVar1 = this->head_;
      if (pMVar1 == (MemoryAccountantAllocationNode *)0x0) {
        return (MemoryAccountantAllocationNode *)0x0;
      }
      if (pMVar1->size_ == size) break;
      this = (MemoryAccountant *)&pMVar1->next_;
    }
    return pMVar1;
  }
  pMVar1 = this->head_;
  do {
    while( true ) {
      pMVar2 = pMVar1;
      if (pMVar2 == (MemoryAccountantAllocationNode *)0x0) {
        return (MemoryAccountantAllocationNode *)0x0;
      }
      pMVar1 = pMVar2->next_;
      if (size <= pMVar2->size_) break;
      if (pMVar1 == (MemoryAccountantAllocationNode *)0x0) {
        return pMVar2;
      }
    }
  } while (pMVar1->size_ - 1 < size);
  return pMVar2;
}

Assistant:

MemoryAccountantAllocationNode* MemoryAccountant::findNodeOfSize(size_t size) const
{
    if (useCacheSizes_) {
        for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_) {
            if (((size > node->size_) && (node->next_ == NULLPTR))
                || ((size <= node->size_) &&
                    !((node->next_->size_ != 0) && (node->next_->size_ <= size))))
                return node;
        }
    }
    else
        for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_)
            if (node->size_ == size)
                return node;
    return NULLPTR;
}